

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::checkMultiplierCharacter(string *unit_string,uint64_t match_flags,char mchar)

{
  bool bVar1;
  __type_conflict _Var2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  char in_DL;
  precise_unit pVar6;
  size_type fd;
  precise_unit retunit;
  string ustring;
  uint64_t in_stack_00000dd8;
  string *in_stack_00000de0;
  undefined7 in_stack_fffffffffffffeb8;
  char in_stack_fffffffffffffebf;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  size_type in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  precise_unit *utest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  uint64_t in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  size_type local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char local_21;
  precise_unit *local_10;
  undefined8 local_8;
  
  local_21 = in_DL;
  std::__cxx11::string::string(in_stack_fffffffffffffed0);
  precise_unit::precise_unit
            ((precise_unit *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  local_60 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                           in_stack_fffffffffffffebf,0x7a1b23);
  if (local_60 != 0xffffffffffffffff) {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebf,0x7a1b5d);
    if (sVar3 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      std::__cxx11::string::string(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      pVar6 = unit_quick_match((string *)
                               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                               in_stack_ffffffffffffff08);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      bVar1 = is_error((precise_unit *)in_stack_fffffffffffffed0);
      local_10 = (precise_unit *)pVar6.multiplier_;
      local_8 = pVar6._8_8_;
      if (!bVar1) goto LAB_007a1ff1;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    while (local_60 != 0xffffffffffffffff) {
      sVar3 = local_60;
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (&local_48);
      if (sVar3 == sVar4 - 1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      }
      else {
        in_stack_ffffffffffffff00 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                        CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
        bVar1 = isDigitCharacter(*(char *)&(in_stack_ffffffffffffff00->_M_dataplus)._M_p);
        if (bVar1) {
          if ((local_60 != 0) &&
             (in_stack_fffffffffffffef8 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                              CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8)),
             *(char *)&(in_stack_fffffffffffffef8->_M_dataplus)._M_p != '^')) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffebf);
          }
        }
        else {
          pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                              CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
          if (*pvVar5 == local_21) {
            local_10 = (precise_unit *)0x7ff4000000000000;
            local_8 = 0xfa94a488;
            goto LAB_007a1ff1;
          }
          pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                              CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
          if ((*pvVar5 != '[') &&
             (in_stack_fffffffffffffee0 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                              CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8)),
             *(char *)&(in_stack_fffffffffffffee0->_M_dataplus)._M_p != '(')) {
            in_stack_fffffffffffffed8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                            CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
            *(value_type *)&(in_stack_fffffffffffffed8->_M_dataplus)._M_p = '*';
          }
        }
      }
      local_60 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                               in_stack_fffffffffffffebf,0x7a1eb7);
    }
    _Var2 = std::operator==(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (((_Var2 ^ 0xffU) & 1) != 0) {
      std::__cxx11::string::string(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      pVar6 = unit_from_string_internal(in_stack_00000de0,in_stack_00000dd8);
      utest = (precise_unit *)pVar6.multiplier_;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      in_stack_fffffffffffffec7 = is_error(utest);
      local_10 = (precise_unit *)pVar6.multiplier_;
      local_8 = pVar6._8_8_;
      if (!(bool)in_stack_fffffffffffffec7) goto LAB_007a1ff1;
    }
  }
  local_10 = (precise_unit *)0x7ff4000000000000;
  local_8 = 0xfa94a488;
LAB_007a1ff1:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  pVar6.base_units_ = (unit_data)(undefined4)local_8;
  pVar6.commodity_ = local_8._4_4_;
  pVar6.multiplier_ = (double)local_10;
  return pVar6;
}

Assistant:

static precise_unit checkMultiplierCharacter(
    const std::string& unit_string,
    std::uint64_t match_flags,
    char mchar)
{
    // assume mchar means multiply
    std::string ustring;
    precise_unit retunit;
    auto fd = unit_string.find_first_of(mchar);
    if (fd != std::string::npos) {
        // if there is a single one just check for a merged unit
        if (unit_string.find_first_of(mchar, fd + 1) == std::string::npos) {
            ustring = unit_string;
            ustring.erase(fd, 1);
            retunit = unit_quick_match(ustring, match_flags);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
        ustring = unit_string;
        while (fd != std::string::npos) {
            if (fd == ustring.size() - 1) {
                ustring.erase(fd, 1);
            } else if (isDigitCharacter(ustring[fd + 1])) {
                if (fd > 0 && ustring[fd - 1] != '^') {
                    ustring.insert(fd, 1, '^');
                    fd += 1;
                }
            } else if (ustring[fd + 1] == mchar) {
                // repeated characters,  cannot mean separator
                return precise::invalid;
            } else if (ustring[fd + 1] != '[' && ustring[fd + 1] != '(') {
                ustring[fd] = '*';
            }
            // ignore adjacent ones
            fd = ustring.find_first_of(mchar, fd + 2);
        }
        if (ustring != unit_string) {
            retunit = unit_from_string_internal(
                ustring, match_flags | skip_partition_check);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}